

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::cast_to_variable_store
          (CompilerGLSL *this,uint32_t target_id,string *expr,SPIRType *expr_type)

{
  bool bVar1;
  uint32_t uVar2;
  string local_1b0;
  undefined1 local_190 [8];
  SPIRType type;
  BaseType expected_type;
  ID local_34;
  BuiltIn builtin;
  SPIRVariable *var;
  SPIRType *expr_type_local;
  string *expr_local;
  CompilerGLSL *pCStack_10;
  uint32_t target_id_local;
  CompilerGLSL *this_local;
  
  var = (SPIRVariable *)expr_type;
  expr_type_local = (SPIRType *)expr;
  expr_local._4_4_ = target_id;
  pCStack_10 = this;
  _builtin = Compiler::maybe_get_backing_variable(&this->super_Compiler,target_id);
  if (_builtin != (SPIRVariable *)0x0) {
    expr_local._4_4_ =
         TypedID::operator_cast_to_unsigned_int((TypedID *)&(_builtin->super_IVariant).self);
  }
  TypedID<(diligent_spirv_cross::Types)0>::TypedID(&local_34,expr_local._4_4_);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,local_34,BuiltIn);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    TypedID<(diligent_spirv_cross::Types)0>::TypedID
              ((TypedID<(diligent_spirv_cross::Types)0> *)
               ((long)&type.member_name_cache._M_h._M_single_bucket + 4),expr_local._4_4_);
    uVar2 = Compiler::get_decoration
                      (&this->super_Compiler,type.member_name_cache._M_h._M_single_bucket._4_4_,
                       BuiltIn);
    type.member_name_cache._M_h._M_single_bucket._0_4_ =
         (*(this->super_Compiler)._vptr_Compiler[0x3f])(this,(ulong)uVar2,(ulong)var->storage);
    if ((StorageClass)type.member_name_cache._M_h._M_single_bucket != var->storage) {
      SPIRType::SPIRType((SPIRType *)local_190,(SPIRType *)var);
      type.super_IVariant.self.id = (StorageClass)type.member_name_cache._M_h._M_single_bucket;
      bitcast_expression(&local_1b0,this,(SPIRType *)local_190,var->storage,
                         (string *)expr_type_local);
      ::std::__cxx11::string::operator=((string *)expr_type_local,(string *)&local_1b0);
      ::std::__cxx11::string::~string((string *)&local_1b0);
      SPIRType::~SPIRType((SPIRType *)local_190);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::cast_to_variable_store(uint32_t target_id, std::string &expr, const SPIRType &expr_type)
{
	auto *var = maybe_get_backing_variable(target_id);
	if (var)
		target_id = var->self;

	// Only interested in standalone builtin variables.
	if (!has_decoration(target_id, DecorationBuiltIn))
		return;

	auto builtin = static_cast<BuiltIn>(get_decoration(target_id, DecorationBuiltIn));
	auto expected_type = get_builtin_basetype(builtin, expr_type.basetype);

	if (expected_type != expr_type.basetype)
	{
		auto type = expr_type;
		type.basetype = expected_type;
		expr = bitcast_expression(type, expr_type.basetype, expr);
	}
}